

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

bool Js::FunctionProxy::IsConstantFunctionName(char16 *srcName)

{
  return (srcName == L"Function code" ||
         (srcName == L"Unknown script code" || srcName == L"anonymous")) ||
         ((srcName == L"Module code" || srcName == L"Global code") ||
         (srcName == L"Anonymous function" || srcName == L"glo"));
}

Assistant:

bool FunctionProxy::IsConstantFunctionName(const char16* srcName)
    {
        if (srcName == Js::Constants::GlobalFunction ||
            srcName == Js::Constants::AnonymousFunction ||
            srcName == Js::Constants::GlobalCode ||
            srcName == Js::Constants::ModuleCode ||
            srcName == Js::Constants::Anonymous ||
            srcName == Js::Constants::UnknownScriptCode ||
            srcName == Js::Constants::FunctionCode)
        {
            return true;
        }
        return false;
    }